

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstance
          (ArenaStringPtr *this,Arena *arena,string *initial_value)

{
  LogMessage *pLVar1;
  string *this_00;
  LogMessage local_68 [63];
  LogFinisher local_29;
  
  if (initial_value == (string *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/arenastring.h"
               ,0x173);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_68,"CHECK failed: initial_value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_29,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(local_68);
  }
  if (arena == (Arena *)0x0) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,(string *)initial_value);
  }
  else {
    Arena::AllocHook(arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    this_00 = (string *)
              google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                        ((ulong)arena,(_func_void_void_ptr *)0x20);
    std::__cxx11::string::string((string *)this_00,(string *)initial_value);
  }
  this->ptr_ = this_00;
  return;
}

Assistant:

PROTOBUF_NOINLINE
  void CreateInstance(Arena* arena, const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    // uses "new ::std::string" when arena is nullptr
    ptr_ = Arena::Create< ::std::string>(arena, *initial_value);
  }